

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Worker *worker)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(worker->Name)._M_dataplus._M_p,(worker->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,worker->Age);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,worker->Salary);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Worker& worker)
    {
        return os << worker.Name << " " << worker.Age << " " << worker.Salary;
    }